

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

string * __thiscall
cmStateDirectory::ConvertToRelPathIfNotContained
          (string *__return_storage_ptr__,cmStateDirectory *this,string *param_1,string *remote_path
          )

{
  pointer pcVar1;
  bool bVar2;
  
  bVar2 = ContainsBoth(this,param_1,remote_path);
  if (bVar2) {
    cmSystemTools::ForceToRelativePath(__return_storage_ptr__,param_1,remote_path);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (remote_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + remote_path->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmStateDirectory::ConvertToRelPathIfNotContained(
  std::string const& local_path, std::string const& remote_path) const
{
  if (!this->ContainsBoth(local_path, remote_path)) {
    return remote_path;
  }
  return cmSystemTools::ForceToRelativePath(local_path, remote_path);
}